

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

int64_t duckdb::DatePart::YearWeekOperator::Operation<duckdb::timestamp_t,long>(timestamp_t input)

{
  date_t date;
  undefined8 in_RAX;
  int iVar1;
  int32_t ww;
  int32_t yyyy;
  undefined8 local_18;
  
  local_18 = in_RAX;
  date = Timestamp::GetDate(input);
  Date::ExtractISOYearWeek(date,(int32_t *)((long)&local_18 + 4),(int32_t *)&local_18);
  iVar1 = -(int)local_18;
  if (0 < local_18._4_4_) {
    iVar1 = (int)local_18;
  }
  return (long)(iVar1 + local_18._4_4_ * 100);
}

Assistant:

int64_t DatePart::YearWeekOperator::Operation(timestamp_t input) {
	return YearWeekOperator::Operation<date_t, int64_t>(Timestamp::GetDate(input));
}